

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O0

bool IsCode(string *ext)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  int iVar1;
  size_type sVar2;
  key_type *in_stack_fffffffffffffd88;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd90;
  key_equal *in_stack_fffffffffffffd98;
  hasher *in_stack_fffffffffffffda0;
  size_type in_stack_fffffffffffffda8;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdb0;
  iterator in_stack_fffffffffffffdb8;
  size_type in_stack_fffffffffffffdc0;
  string *psVar3;
  string *local_238;
  undefined1 local_181 [5];
  allocator local_17c;
  allocator local_17b;
  allocator local_17a;
  allocator local_179;
  allocator local_178;
  allocator local_177;
  allocator local_176;
  allocator local_175 [20];
  allocator local_161;
  string *local_160;
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  string *local_18;
  undefined8 local_10;
  
  if (IsCode(std::__cxx11::string_const&)::exts_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&IsCode(std::__cxx11::string_const&)::exts_abi_cxx11_);
    if (iVar1 != 0) {
      local_181[3] = 1;
      local_160 = local_158;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_158,".c",&local_161);
      local_160 = local_138;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_138,".C",local_175);
      local_160 = local_118;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_118,".cc",&local_176);
      local_160 = local_f8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f8,".cpp",&local_177);
      local_160 = local_d8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d8,".m",&local_178);
      local_160 = local_b8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,".mm",&local_179);
      local_160 = local_98;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,".h",&local_17a);
      local_160 = local_78;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,".H",&local_17b);
      local_160 = local_58;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_58,".hpp",&local_17c);
      local_160 = local_38;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_38,".hh",(allocator *)(local_181 + 4));
      local_181[3] = 0;
      local_18 = local_158;
      local_10 = 10;
      in_stack_fffffffffffffd88 = (key_type *)local_181;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x19dcf9);
      __l._M_len = in_stack_fffffffffffffdc0;
      __l._M_array = in_stack_fffffffffffffdb8;
      std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::unordered_set(in_stack_fffffffffffffdb0,__l,in_stack_fffffffffffffda8,
                      in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                      (allocator_type *)in_stack_fffffffffffffd88);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x19dd43);
      psVar3 = local_158;
      local_238 = (string *)&local_18;
      do {
        local_238 = local_238 + -0x20;
        std::__cxx11::string::~string(local_238);
      } while (local_238 != psVar3);
      std::allocator<char>::~allocator((allocator<char> *)(local_181 + 4));
      std::allocator<char>::~allocator((allocator<char> *)&local_17c);
      std::allocator<char>::~allocator((allocator<char> *)&local_17b);
      std::allocator<char>::~allocator((allocator<char> *)&local_17a);
      std::allocator<char>::~allocator((allocator<char> *)&local_179);
      std::allocator<char>::~allocator((allocator<char> *)&local_178);
      std::allocator<char>::~allocator((allocator<char> *)&local_177);
      std::allocator<char>::~allocator((allocator<char> *)&local_176);
      std::allocator<char>::~allocator((allocator<char> *)local_175);
      std::allocator<char>::~allocator((allocator<char> *)&local_161);
      __cxa_atexit(std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,&IsCode(std::__cxx11::string_const&)::exts_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&IsCode(std::__cxx11::string_const&)::exts_abi_cxx11_);
    }
  }
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  return sVar2 != 0;
}

Assistant:

static bool IsCode(const std::string &ext) {
    static const std::unordered_set<std::string> exts = { ".c", ".C", ".cc", ".cpp", ".m", ".mm", ".h", ".H", ".hpp", ".hh" };
    return exts.count(ext) > 0;
}